

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubtreeWrapper.cpp
# Opt level: O0

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CExpressionWrapper::ToConditional
          (CExpressionWrapper *this,CLabel *labelTrue,CLabel *labelFalse)

{
  CJumpConditionalStatement *this_00;
  CConstExpression *this_01;
  CLabelStatement *pCVar1;
  CLabel *in_RCX;
  CLabel local_c0;
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> local_a0;
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> local_98;
  undefined1 local_89;
  CLabel local_88;
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> local_68;
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
  local_60 [3];
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_48;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_40;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_38;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_30 [2];
  CLabel *labelFalse_local;
  CLabel *labelTrue_local;
  CExpressionWrapper *this_local;
  
  labelFalse_local = labelFalse;
  labelTrue_local = labelTrue;
  this_local = this;
  this_00 = (CJumpConditionalStatement *)operator_new(0x30);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_38,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &labelTrue->field_0x8);
  this_01 = (CConstExpression *)operator_new(0x10);
  CConstExpression::CConstExpression(this_01,0);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_48,(pointer)this_01);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_40,&local_48);
  pCVar1 = (CLabelStatement *)operator_new(0x28);
  local_89 = 1;
  CLabel::CLabel(&local_88,labelFalse);
  CLabelStatement::CLabelStatement(pCVar1,&local_88);
  local_89 = 0;
  std::unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>::
  unique_ptr<std::default_delete<IRT::CLabelStatement_const>,void>
            ((unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>
              *)&local_68,pCVar1);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  unique_ptr(local_60,&local_68);
  pCVar1 = (CLabelStatement *)operator_new(0x28);
  CLabel::CLabel(&local_c0,in_RCX);
  CLabelStatement::CLabelStatement(pCVar1,&local_c0);
  std::unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>::
  unique_ptr<std::default_delete<IRT::CLabelStatement_const>,void>
            ((unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>
              *)&local_a0,pCVar1);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  unique_ptr(&local_98,&local_a0);
  CJumpConditionalStatement::CJumpConditionalStatement
            (this_00,NOT_EQUALS,&local_38,&local_40,local_60,&local_98);
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             local_30,(pointer)this_00);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)this,
             local_30);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (local_30);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr(&local_98);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr(&local_a0);
  CLabel::~CLabel(&local_c0);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr(local_60);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr(&local_68);
  CLabel::~CLabel(&local_88);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_40);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_48);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_38);
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> CExpressionWrapper::ToConditional( CLabel labelTrue, CLabel labelFalse ) {
        return std::move( std::unique_ptr<const CStatement>(
                new CJumpConditionalStatement(
                        enums::TLogicOperator::NOT_EQUALS,
                        std::move( expression ),
                        std::move( std::unique_ptr<const CExpression>( new CConstExpression( 0 ))),
                        std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( labelTrue ))),
                        std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( labelFalse )))
                )
        ));
    }